

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cc
# Opt level: O3

char * Varint::Skip64BackwardSlow(char *p,char *b)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  
  if (p < b) {
    __assert_fail("ptr >= base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/varint.cc"
                  ,0x107,"static const char *Varint::Skip64BackwardSlow(const char *, const char *)"
                 );
  }
  if ((p == b) || (p[-1] < '\0')) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = p + -1;
    if (pcVar1 != b) {
      pcVar5 = p + -2;
      lVar2 = 0;
      do {
        if (-1 < *pcVar5) {
          return pcVar1 + -lVar2;
        }
        lVar3 = lVar2 + 1;
        uVar4 = (uint)lVar2;
      } while ((pcVar5 != b) && (pcVar5 = pcVar5 + -1, lVar2 = lVar3, uVar4 < 9));
      pcVar1 = pcVar1 + -lVar3;
      if (8 < uVar4) {
        pcVar1 = (char *)0x0;
      }
    }
  }
  return pcVar1;
}

Assistant:

const char* Varint::Skip64BackwardSlow(const char* p, const char* b) {
  const unsigned char* ptr = reinterpret_cast<const unsigned char*>(p);
  const unsigned char* base = reinterpret_cast<const unsigned char*>(b);
  assert(ptr >= base);

  // If the initial pointer is at the base or if the previous byte is not
  // the last byte of a varint, we return nullptr since there is nothing to
  // skip.
  if (ptr == base) return nullptr;
  if (*(--ptr) > 127) return nullptr;

  for (int i = 0; i < 10; i++) {
    if (ptr == base)    return reinterpret_cast<const char*>(ptr);
    if (*(--ptr) < 128) return reinterpret_cast<const char*>(ptr + 1);
  }

  return nullptr; // value is too long to be a varint64
}